

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 11.cpp
# Opt level: O3

int main(void)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  int x;
  char eme [8];
  int local_1c;
  char local_18 [8];
  
  builtin_strncpy(local_18,"\x1b[1;35m",8);
  sVar1 = strlen(local_18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_18,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Qual o dia em que nietzsche nasceu?",0x23);
  std::istream::operator>>((istream *)&std::cin,&local_1c);
  if (local_1c < 0x14) {
    if (local_1c == 10) {
      pcVar3 = 
      "Cinco dias a mais e voce estaria correto. Nietzsche nasceu dia 15 de outubro de 1844.";
      lVar2 = 0x55;
      goto LAB_001012bd;
    }
    if (local_1c == 0xf) {
      pcVar3 = "YES! No dia 15 de outubro de 1844 nasceu a Aurora niilista dual! um espetaculo.";
      lVar2 = 0x4f;
      goto LAB_001012bd;
    }
  }
  else {
    if (local_1c == 0x14) {
      pcVar3 = 
      "Cinco dias a menos e voce estaria correto. Nieyzsche nasceu dia 15 de outubro de 1944.";
      lVar2 = 0x56;
      goto LAB_001012bd;
    }
    if (local_1c == 0x1e) {
      pcVar3 = 
      "Quinze dias a menos e voce estaria correto. Nietzsche nasceu dia 15 de outubro de 1944.";
      lVar2 = 0x57;
      goto LAB_001012bd;
    }
  }
  pcVar3 = "Sorry, tente novamente.";
  lVar2 = 0x17;
LAB_001012bd:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
    char eme[] = {0x1b, '[', '1', ';', '3', '5', 'm', 0};
    cout << eme;
    int x;

    cout << "Qual o dia em que nietzsche nasceu?";
    cin >> x;

    switch (x)
    {
    case 15:
        cout << "YES! No dia 15 de outubro de 1844 nasceu a Aurora niilista dual! um espetaculo." << endl;
        break;
    case 10:
        cout << "Cinco dias a mais e voce estaria correto. Nietzsche nasceu dia 15 de outubro de 1844." << endl;
        break;
    case 20:
        cout << "Cinco dias a menos e voce estaria correto. Nieyzsche nasceu dia 15 de outubro de 1944." << endl;
        break;
    case 30:
        cout << "Quinze dias a menos e voce estaria correto. Nietzsche nasceu dia 15 de outubro de 1944." << endl;
        break;
    default:
        cout << "Sorry, tente novamente." << endl;
        break;
    }

    return 0;
}